

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olf.h
# Opt level: O3

void __thiscall
OLF<4U>::Check(OLF<4U> *this,HashMap<4U> *mp,
              vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
              *outs)

{
  double dVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  double dVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  ostream *poVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  _Hash_node_base *p_Var15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 in_XMM2_Qb;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  p_Var15 = (mp->_M_h)._M_before_begin._M_nxt;
  if (p_Var15 == (_Hash_node_base *)0x0) {
    auVar16 = ZEXT816(0) << 0x40;
    dVar18 = 0.0;
  }
  else {
    iVar11 = 0;
    iVar14 = 0;
    iVar13 = 0;
    do {
      iVar8 = (*(this->super_Abstract<4U>)._vptr_Abstract[2])(this,p_Var15 + 1);
      iVar3 = *(int *)((long)&p_Var15[1]._M_nxt + 4);
      iVar4 = (this->super_Abstract<4U>).HIT;
      if (iVar4 < iVar3) {
        iVar13 = iVar13 + 1;
        if (iVar4 < iVar8) {
          iVar14 = iVar14 + 1;
          iVar10 = iVar3 - iVar8;
          iVar12 = -iVar10;
          if (0 < iVar10) {
            iVar12 = iVar10;
          }
          auVar19._0_8_ = (double)iVar12;
          auVar19._8_8_ = in_XMM2_Qb;
          auVar16._0_8_ = auVar19._0_8_ / (double)iVar3;
          auVar16._8_8_ = in_XMM2_Qb;
          auVar16 = vunpcklpd_avx(auVar19,auVar16);
          (this->super_Abstract<4U>).aae = auVar16._0_8_ + (this->super_Abstract<4U>).aae;
          (this->super_Abstract<4U>).are = auVar16._8_8_ + (this->super_Abstract<4U>).are;
        }
      }
      iVar11 = iVar11 + (uint)(iVar4 < iVar8);
      p_Var15 = p_Var15->_M_nxt;
    } while (p_Var15 != (_Hash_node_base *)0x0);
    dVar18 = (double)iVar14;
    auVar17._0_8_ = (double)iVar13;
    auVar17._8_8_ = in_XMM2_Qb;
    auVar21._0_8_ = (double)iVar11;
    auVar21._8_8_ = in_XMM2_Qb;
    auVar16 = vunpcklpd_avx(auVar21,auVar17);
  }
  auVar2._0_8_ = (this->super_Abstract<4U>).aae;
  auVar2._8_8_ = (this->super_Abstract<4U>).are;
  auVar20._8_8_ = dVar18;
  auVar20._0_8_ = dVar18;
  auVar19 = vdivpd_avx(auVar2,auVar20);
  (this->super_Abstract<4U>).aae = (double)auVar19._0_8_;
  (this->super_Abstract<4U>).are = (double)auVar19._8_8_;
  auVar16 = vdivpd_avx(auVar20,auVar16);
  (this->super_Abstract<4U>).pr = (double)auVar16._0_8_;
  (this->super_Abstract<4U>).cr = (double)auVar16._8_8_;
  auVar16 = vshufpd_avx(auVar19,auVar19,1);
  poVar9 = std::ostream::_M_insert<double>(auVar16._0_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
  poVar9 = std::ostream::_M_insert<double>((this->super_Abstract<4U>).cr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
  poVar9 = std::ostream::_M_insert<double>((this->super_Abstract<4U>).pr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
  dVar18 = (this->super_Abstract<4U>).pr;
  dVar1 = (this->super_Abstract<4U>).cr;
  dVar5 = dVar18 + dVar1;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar5;
  uVar6 = vcmpsd_avx512f(auVar22,ZEXT816(0x3eb0c6f7a0b5ed8d),1);
  bVar7 = (bool)((byte)uVar6 & 1);
  poVar9 = std::ostream::_M_insert<double>
                     (((dVar18 + dVar18) * dVar1) /
                      (double)((ulong)bVar7 * 0x3ff0000000000000 + (ulong)!bVar7 * (long)dVar5));
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
  return;
}

Assistant:

void Check(HashMap<DATA_LEN> mp, const std::vector<std::ostream*>& outs) {
		typename HashMap<DATA_LEN>::iterator it;
		int value = 0, all = 0, hit = 0, size = 0;
		for (it = mp.begin(); it != mp.end(); ++it) {
			value = Query(it->first);
			if (it->second > this->HIT) {
				all++;
				if (value > this->HIT) {
					hit += 1;
					this->aae += abs(it->second - value);
					this->are += abs(it->second - value) / (double)it->second;
				}
			}
			if (value > this->HIT) size += 1;
		}
		this->aae /= hit;
		this->are /= hit;
		this->cr = hit / (double)all;
		this->pr = hit / (double)size;
		*outs[0] << this->are << ",";
		*outs[1] << this->cr << ",";
		*outs[2] << this->pr << ",";
		*outs[3] << 2 * this->pr * this->cr / ((this->cr + this->pr < 1e-6) ? 1 : this->cr + this->pr) << ",";
	}